

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.c
# Opt level: O3

_Bool container_iterator_read_into_uint32
                (container_t *c,uint8_t typecode,roaring_container_iterator_t *it,uint32_t high16,
                uint32_t *buf,uint32_t count,uint32_t *consumed,uint16_t *value_out)

{
  ushort uVar1;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  byte bVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  uint32_t uVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  long lVar15;
  uint uVar16;
  ulong *puVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  long lVar20;
  
  *consumed = 0;
  auVar4 = _DAT_00134100;
  auVar3 = _DAT_001340f0;
  if (count == 0) {
    return false;
  }
  if (typecode == '\x01') {
    iVar7 = it->index;
    iVar14 = iVar7 + 0x3f;
    if (-1 < iVar7) {
      iVar14 = iVar7;
    }
    uVar13 = (ulong)(uint)(iVar14 >> 6);
    lVar2 = *(long *)((long)c + 8);
    bVar5 = (byte)(iVar7 % 0x40);
    uVar9 = (*(ulong *)(lVar2 + uVar13 * 8) >> (bVar5 & 0x3f)) << (bVar5 & 0x3f);
    uVar6 = 0;
    do {
      if (uVar9 != 0) {
        do {
          if (count <= uVar6) goto LAB_0012b918;
          lVar15 = 0;
          if (uVar9 != 0) {
            for (; (uVar9 >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
            }
          }
          *buf = (uint)lVar15 | (int)uVar13 << 6 | high16;
          buf = buf + 1;
          uVar6 = *consumed + 1;
          *consumed = uVar6;
          uVar9 = uVar9 & uVar9 - 1;
        } while (uVar9 != 0);
      }
      uVar12 = (int)uVar13 + 1;
      if (0x3ff < uVar12) {
        return false;
      }
      puVar17 = (ulong *)(lVar2 + (ulong)uVar12 * 8);
      do {
        uVar12 = (int)uVar13 + 1;
        uVar13 = (ulong)uVar12;
        uVar9 = *puVar17;
        if (uVar9 != 0) break;
        puVar17 = puVar17 + 1;
      } while (uVar12 < 0x3ff);
      if (uVar9 == 0) {
        return false;
      }
LAB_0012b918:
    } while (uVar6 < count);
    lVar2 = 0;
    if (uVar9 != 0) {
      for (; (uVar9 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
      }
    }
    uVar6 = (uint)lVar2 | (int)uVar13 << 6;
    it->index = uVar6;
  }
  else {
    if (typecode != '\x02') {
      lVar2 = *(long *)((long)c + 8);
      uVar12 = (uint)*value_out;
      uVar6 = 0;
      do {
        uVar10 = (uint)*(ushort *)(lVar2 + 2 + (long)it->index * 4) +
                 (uint)*(ushort *)(lVar2 + (long)it->index * 4);
        uVar12 = uVar12 & 0xffff;
        uVar8 = (uVar10 - uVar12) + 1;
        uVar16 = count - uVar6;
        if (uVar8 < count - uVar6) {
          uVar16 = uVar8;
        }
        if (uVar16 == 0) {
          uVar9 = 0;
        }
        else {
          uVar9 = (ulong)uVar16;
          lVar15 = uVar9 - 1;
          auVar18._8_4_ = (int)lVar15;
          auVar18._0_8_ = lVar15;
          auVar18._12_4_ = (int)((ulong)lVar15 >> 0x20);
          lVar15 = 1;
          auVar18 = auVar18 ^ auVar4;
          auVar19 = auVar3;
          uVar6 = uVar12;
          do {
            auVar21 = auVar19 ^ auVar4;
            if ((bool)(~(auVar18._4_4_ < auVar21._4_4_ ||
                        auVar18._0_4_ < auVar21._0_4_ && auVar21._4_4_ == auVar18._4_4_) & 1)) {
              buf[lVar15 + -1] = uVar6 | high16;
            }
            if (auVar21._12_4_ <= auVar18._12_4_ &&
                (auVar21._8_4_ <= auVar18._8_4_ || auVar21._12_4_ != auVar18._12_4_)) {
              buf[lVar15] = uVar6 + 1 | high16;
            }
            lVar20 = auVar19._8_8_;
            auVar19._0_8_ = auVar19._0_8_ + 2;
            auVar19._8_8_ = lVar20 + 2;
            lVar20 = lVar15 - (uVar9 + 1 & 0xfffffffffffffffe);
            lVar15 = lVar15 + 2;
            uVar6 = uVar6 + 2;
          } while (lVar20 != -1);
          uVar6 = *consumed;
        }
        uVar12 = uVar12 + uVar16;
        *value_out = (uint16_t)uVar12;
        uVar6 = uVar6 + uVar16;
        *consumed = uVar6;
        if (((uint16_t)uVar12 == 0) || (uVar10 < (uVar12 & 0xffff))) {
          iVar7 = it->index;
          iVar14 = iVar7 + 1;
          it->index = iVar14;
          if (*c <= iVar14) {
            return false;
          }
          uVar1 = *(ushort *)(lVar2 + 4 + (long)iVar7 * 4);
          uVar12 = (uint)uVar1;
          *value_out = uVar1;
          uVar6 = *consumed;
        }
        buf = buf + uVar9;
      } while (uVar6 < count);
      return true;
    }
    uVar6 = *c - it->index;
    if (count <= uVar6) {
      uVar6 = count;
    }
    uVar11 = 0;
    if (*c != it->index) {
      lVar2 = *(long *)((long)c + 8);
      uVar9 = 0;
      do {
        buf[uVar9] = *(ushort *)(lVar2 + (ulong)(uint)(it->index + (int)uVar9) * 2) | high16;
        uVar9 = uVar9 + 1;
      } while (uVar6 + (uVar6 == 0) != uVar9);
      uVar11 = *consumed;
    }
    *consumed = uVar11 + uVar6;
    iVar7 = uVar6 + it->index;
    it->index = iVar7;
    if (*c <= iVar7) {
      return false;
    }
    uVar6 = (uint)*(ushort *)(*(long *)((long)c + 8) + (long)iVar7 * 2);
  }
  *value_out = (uint16_t)uVar6;
  return true;
}

Assistant:

bool container_iterator_read_into_uint32(const container_t *c, uint8_t typecode,
                                         roaring_container_iterator_t *it,
                                         uint32_t high16, uint32_t *buf,
                                         uint32_t count, uint32_t *consumed,
                                         uint16_t *value_out) {
    *consumed = 0;
    if (count == 0) {
        return false;
    }
    switch (typecode) {
        case BITSET_CONTAINER_TYPE: {
            const bitset_container_t *bc = const_CAST_bitset(c);
            uint32_t wordindex = it->index / 64;
            uint64_t word =
                bc->words[wordindex] & (UINT64_MAX << (it->index % 64));
            do {
                // Read set bits.
                while (word != 0 && *consumed < count) {
                    *buf = high16 |
                           (wordindex * 64 + roaring_trailing_zeroes(word));
                    word = word & (word - 1);
                    buf++;
                    (*consumed)++;
                }
                // Skip unset bits.
                while (word == 0 &&
                       wordindex + 1 < BITSET_CONTAINER_SIZE_IN_WORDS) {
                    wordindex++;
                    word = bc->words[wordindex];
                }
            } while (word != 0 && *consumed < count);

            if (word != 0) {
                it->index = wordindex * 64 + roaring_trailing_zeroes(word);
                *value_out = it->index;
                return true;
            }
            return false;
        }
        case ARRAY_CONTAINER_TYPE: {
            const array_container_t *ac = const_CAST_array(c);
            uint32_t num_values =
                minimum_uint32(ac->cardinality - it->index, count);
            for (uint32_t i = 0; i < num_values; i++) {
                buf[i] = high16 | ac->array[it->index + i];
            }
            *consumed += num_values;
            it->index += num_values;
            if (it->index < ac->cardinality) {
                *value_out = ac->array[it->index];
                return true;
            }
            return false;
        }
        case RUN_CONTAINER_TYPE: {
            const run_container_t *rc = const_CAST_run(c);
            do {
                uint32_t largest_run_value =
                    rc->runs[it->index].value + rc->runs[it->index].length;
                uint32_t num_values = minimum_uint32(
                    largest_run_value - *value_out + 1, count - *consumed);
                for (uint32_t i = 0; i < num_values; i++) {
                    buf[i] = high16 | (*value_out + i);
                }
                *value_out += num_values;
                buf += num_values;
                *consumed += num_values;

                // We check for `value == 0` because `it->value += num_values`
                // can overflow when `value == UINT16_MAX`, and `count >
                // length`. In this case `value` will overflow to 0.
                if (*value_out > largest_run_value || *value_out == 0) {
                    it->index++;
                    if (it->index < rc->n_runs) {
                        *value_out = rc->runs[it->index].value;
                    } else {
                        return false;
                    }
                }
            } while (*consumed < count);
            return true;
        }
        default:
            assert(false);
            roaring_unreachable;
            return 0;
    }
}